

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O1

void __thiscall
TasGrid::GridSequence::integrateHierarchicalFunctions(GridSequence *this,double *integrals)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int j;
  ulong uVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  vector<double,_std::allocator<double>_> integ;
  vector<double,_std::allocator<double>_> local_38;
  
  lVar6 = 0x18;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar6 = 0x40;
  }
  lVar7 = (long)*(int *)((long)&(this->super_BaseCanonicalGrid).acceleration + lVar6);
  cacheBasisIntegrals(&local_38,this);
  if (0 < lVar7) {
    lVar2 = *(long *)((long)&(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid + lVar6);
    lVar6 = *(long *)((long)&(this->super_BaseCanonicalGrid).num_dimensions + lVar6);
    uVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
    lVar3 = 0;
    lVar4 = lVar6;
    do {
      dVar8 = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[*(int *)(lVar6 + lVar2 * lVar3 * 4)];
      if (1 < (int)uVar1) {
        uVar5 = 1;
        do {
          dVar8 = dVar8 * local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[*(int *)(lVar4 + uVar5 * 4)];
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
      integrals[lVar3] = dVar8;
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + lVar2 * 4;
    } while (lVar3 != lVar7);
  }
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridSequence::integrateHierarchicalFunctions(double integrals[]) const{
    const MultiIndexSet& work = (points.empty()) ? needed : points;
    int const num_points = work.getNumIndexes();
    std::vector<double> integ = cacheBasisIntegrals();
    for(int i=0; i<num_points; i++){
        const int* p = work.getIndex(i);
        double w = integ[p[0]];
        for(int j=1; j<num_dimensions; j++){
            w *= integ[p[j]];
        }
        integrals[i] = w;
    }
}